

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O1

void __thiscall
burst::algorithm::bitap<char,unsigned_short,std::array<unsigned_short,256ul>>::
bitap<std::__cxx11::string>
          (bitap<char,unsigned_short,std::array<unsigned_short,256ul>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern)

{
  undefined1 local_19;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_10._M_current = (pattern->_M_dataplus)._M_p;
  local_18._M_current = local_10._M_current + pattern->_M_string_length;
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,256ul>>const,std::allocator<burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,256ul>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),
             (element_position_bitmask_table<std::array<unsigned_short,_256UL>_> **)this,
             (allocator<burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>_>
              *)&local_19,&local_10,&local_18);
  if (*(ulong *)(*(long *)this + 0x200) < 0x11) {
    return;
  }
  __assert_fail("m_bitmask_table->length() <= bitmask_size",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/searching/bitap.hpp"
                ,0x4c,
                "burst::algorithm::bitap<char, unsigned short>::bitap(const ForwardRange &) [Value = char, Bitmask = unsigned short, Map = std::array<unsigned short, 256>, ForwardRange = std::basic_string<char>]"
               );
}

Assistant:

explicit bitap (const ForwardRange & pattern):
                m_bitmask_table
                (
                    std::make_shared<const bitmask_table_type>(pattern.begin(), pattern.end())
                )
            {
                BOOST_ASSERT(m_bitmask_table->length() <= bitmask_size);
            }